

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

MemChunk * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::treeMalloc
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,size_type size)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  PtrAVLTree *this_00;
  undefined4 extraout_var;
  PtrAVLTree *tree;
  uint K;
  uint X;
  BinIndexType binIndex;
  size_type actualSize;
  MemChunk *chunk;
  size_type size_local;
  MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  actualSize = 0;
  uVar3 = (uint)(size >> 8);
  _X = size;
  chunk = (MemChunk *)size;
  size_local = (size_type)this;
  if (uVar3 == 0) {
    K = 0;
  }
  else if (uVar3 < 0x10000) {
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar4 = 0x1f - (uVar1 ^ 0x1f);
    K = iVar4 * 2 + ((uint)(size >> ((char)iVar4 + 7U & 0x3f)) & 1);
  }
  else {
    K = 0x1f;
  }
  for (; K < 0x20; K = K + 1) {
    this_00 = treeAt(this,K);
    bVar2 = PtrAVLTree::isEmpty(this_00);
    if (!bVar2) {
      iVar4 = PtrAVLTree::remove(this_00,(char *)&X);
      actualSize = CONCAT44(extraout_var,iVar4);
      if (actualSize != 0) break;
    }
  }
  if (actualSize == 0) {
    this_local = (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)0x0;
  }
  else {
    this_local = (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)
                 splitChunk(this,(MemChunk *)actualSize,(size_type)chunk);
  }
  return (MemChunk *)this_local;
}

Assistant:

inline MemChunk*
    treeMalloc (size_type size)
    {
        MemChunk* chunk = nullptr;
        size_type  actualSize = size;

        BinIndexType binIndex;
        cookmem_getLargeBinIndex (size, binIndex);

        for (; binIndex < NTREEBINS; ++binIndex)
        {
            PtrAVLTree& tree = treeAt(binIndex);
            if (!tree.isEmpty ())
            {
                chunk = reinterpret_cast<MemChunk*>(tree.remove(actualSize));
                if (chunk != nullptr)
                    break;
            }
        }

        if (chunk != nullptr)
        {
            return splitChunk (chunk, size);
        }
        return nullptr;
    }